

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O3

void __thiscall pg::FPISolver::runPar(FPISolver *this)

{
  bitset *this_00;
  bitset *this_01;
  size_t sVar1;
  int *piVar2;
  Game *pGVar3;
  ostream *poVar4;
  int strategy;
  ulong uVar5;
  long lVar6;
  TD_fpi_run_par *t;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 local_68 [64];
  
  this_00 = &this->parity;
  bitset::resize(this_00,((this->super_Solver).game)->n_vertices);
  this_01 = &this->distraction;
  bitset::resize(this_01,((this->super_Solver).game)->n_vertices);
  sVar1 = (this->parity)._bitssize;
  if (sVar1 != 0) {
    memset(this_00->_bits,0,sVar1 << 3);
  }
  sVar1 = (this->distraction)._bitssize;
  if (sVar1 != 0) {
    memset(this_01->_bits,0,sVar1 << 3);
  }
  uVar9 = ((this->super_Solver).game)->n_vertices;
  uVar8 = uVar9 << 2;
  uVar9 = -(ulong)(uVar9 >> 0x3e != 0) | uVar8;
  piVar2 = (int *)operator_new__(uVar9);
  this->strategy = piVar2;
  piVar2 = (int *)operator_new__(uVar9);
  this->frozen = piVar2;
  memset(piVar2,0,uVar8);
  local_68._0_8_ = fpi_run_par_WRAP;
  local_68._8_8_ = (__pointer_type)0x1;
  local_68._16_8_ = this;
  lace_run_task((Task *)local_68);
  pGVar3 = (this->super_Solver).game;
  lVar6 = pGVar3->n_vertices;
  if (0 < lVar6) {
    uVar9 = 0;
    do {
      uVar8 = uVar9 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar8] >> (uVar9 & 0x3f) & 1) == 0) {
        uVar5 = 1L << (uVar9 & 0x3f);
        bVar7 = ((this_01->_bits[uVar8] & uVar5) != 0) != ((this_00->_bits[uVar8] & uVar5) != 0);
        strategy = -1;
        if (bVar7 != (((pGVar3->_owner)._bits[uVar8] & uVar5) == 0)) {
          strategy = this->strategy[uVar9];
        }
        Oink::solve((this->super_Solver).oink,(int)uVar9,(uint)bVar7,strategy);
        pGVar3 = (this->super_Solver).game;
        lVar6 = pGVar3->n_vertices;
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < lVar6);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->frozen != (int *)0x0) {
    operator_delete__(this->frozen);
  }
  poVar4 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"solved with ",0xc);
  poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," iterations.",0xc);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void
FPISolver::runPar()
{
    /**
     * Allocate and initialize data structures
     */

    parity.resize(nodecount());
    distraction.resize(nodecount());
    parity.reset();
    distraction.reset();
    strategy = new int[nodecount()]; // the current strategy for winning the game
    frozen = new int[nodecount()]; // records for every vertex at which level it is frozen (or 0 if not frozen)

    memset(frozen, 0, sizeof(int[nodecount()])); // initially no vertex is frozen (we don't freeze at level 0)

    RUN(fpi_run_par, this);

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;
    delete[] frozen;

    logger << "solved with " << iterations << " iterations." << std::endl;
}